

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootCheck2(void *arkode_mem)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  double dVar11;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x20d,"arkRootCheck2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    return -0x15;
  }
  puVar4 = *(undefined8 **)((long)arkode_mem + 0x3d8);
  if (*(int *)((long)puVar4 + 100) != 0) {
    ARKodeGetDky(arkode_mem,(sunrealtype)puVar4[4],0,*(N_Vector *)((long)arkode_mem + 0x248));
    iVar7 = (*(code *)*puVar4)(puVar4[4],*(undefined8 *)((long)arkode_mem + 0x248),puVar4[7],
                               puVar4[0x10]);
    puVar4[0xd] = puVar4[0xd] + 1;
    if (iVar7 != 0) {
      return -0xc;
    }
    if (*(int *)(puVar4 + 1) < 1) {
      return 0;
    }
    lVar5 = puVar4[2];
    lVar8 = 0;
    do {
      *(undefined4 *)(lVar5 + lVar8 * 4) = 0;
      lVar8 = lVar8 + 1;
      lVar10 = (long)*(int *)(puVar4 + 1);
    } while (lVar8 < lVar10);
    if (0 < *(int *)(puVar4 + 1)) {
      lVar5 = puVar4[0xe];
      bVar9 = true;
      lVar8 = 0;
      do {
        while (((*(int *)(lVar5 + lVar8 * 4) == 0 ||
                (dVar1 = *(double *)(puVar4[7] + lVar8 * 8), dVar1 != 0.0)) || (NAN(dVar1)))) {
          lVar8 = lVar8 + 1;
          if ((int)lVar10 <= lVar8) {
            if (bVar9) {
              return 0;
            }
            goto LAB_0015c1bf;
          }
        }
        *(undefined4 *)(puVar4[2] + lVar8 * 4) = 1;
        lVar10 = (long)*(int *)(puVar4 + 1);
        lVar8 = lVar8 + 1;
        bVar9 = false;
      } while (lVar8 < lVar10);
LAB_0015c1bf:
      dVar1 = *(double *)((long)arkode_mem + 0x2c0);
      dVar2 = *(double *)((long)arkode_mem + 0x2f0);
      dVar11 = (ABS(dVar1) + ABS(dVar2)) * *(double *)((long)arkode_mem + 8) * 100.0;
      puVar4[0xb] = dVar11;
      dVar11 = (double)puVar4[4] +
               (double)(~-(ulong)(0.0 < dVar1) & (ulong)-dVar11 |
                       (ulong)dVar11 & -(ulong)(0.0 < dVar1));
      if (0.0 <= (dVar11 - dVar2) * dVar1) {
        N_VLinearSum(0x3ff0000000000000,*(N_Vector *)((long)arkode_mem + 0x248),
                     *(undefined8 *)((long)arkode_mem + 600));
      }
      else {
        ARKodeGetDky(arkode_mem,dVar11,0,*(N_Vector *)((long)arkode_mem + 0x248));
      }
      iVar7 = (*(code *)*puVar4)(dVar11,*(undefined8 *)((long)arkode_mem + 0x248),puVar4[8],
                                 puVar4[0x10]);
      puVar4[0xd] = puVar4[0xd] + 1;
      if (iVar7 != 0) {
        return -0xc;
      }
      iVar7 = *(int *)(puVar4 + 1);
      if (0 < iVar7) {
        lVar5 = puVar4[0xe];
        lVar8 = 0;
        bVar6 = 0;
        do {
          if (*(int *)(lVar5 + lVar8 * 4) != 0) {
            dVar1 = *(double *)(puVar4[8] + lVar8 * 8);
            iVar3 = *(int *)(puVar4[2] + lVar8 * 4);
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              if (iVar3 == 1) {
                *(double *)(puVar4[7] + lVar8 * 8) = dVar1;
              }
            }
            else {
              if (iVar3 == 1) {
                return 3;
              }
              *(undefined4 *)(puVar4[2] + lVar8 * 4) = 1;
              iVar7 = *(int *)(puVar4 + 1);
              bVar6 = 1;
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar7);
        return (uint)bVar6;
      }
    }
  }
  return 0;
}

Assistant:

int arkRootCheck2(void* arkode_mem)
{
  int i, retval;
  sunrealtype smallh, tplus;
  sunbooleantype zroot;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  /* return if no roots in previous step */
  if (rootmem->irfnd == 0) { return (ARK_SUCCESS); }

  /* Set ark_ycur = y(tlo) */
  (void)ARKodeGetDky(ark_mem, rootmem->tlo, 0, ark_mem->ycur);

  /* Evaluate root-finding function: glo = g(tlo, y(tlo)) */
  retval = rootmem->gfun(rootmem->tlo, ark_mem->ycur, rootmem->glo,
                         rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* reset root-finding flags (overall, and for specific eqns) */
  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->iroots[i] = 0; }

  /* for all active roots, check if glo_i == 0 to mark roots found */
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->glo[i]) == ZERO)
    {
      zroot              = SUNTRUE;
      rootmem->iroots[i] = 1;
    }
  }
  if (!zroot) { return (ARK_SUCCESS); /* return if no roots */ }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  /*     set time tolerance */
  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;
  /*     set tplus = tlo + smallh */
  smallh = (ark_mem->h > ZERO) ? rootmem->ttol : -rootmem->ttol;
  tplus  = rootmem->tlo + smallh;
  /*     update ark_ycur with small explicit Euler step (if tplus is past tn) */
  if ((tplus - ark_mem->tcur) * ark_mem->h >= ZERO)
  {
    /* hratio = smallh/ark_mem->h; */
    N_VLinearSum(ONE, ark_mem->ycur, smallh, ark_mem->fn, ark_mem->ycur);
  }
  else
  {
    /*   set ark_ycur = y(tplus) via interpolation */
    (void)ARKodeGetDky(ark_mem, tplus, 0, ark_mem->ycur);
  }
  /*     set ghi = g(tplus,y(tplus)) */
  retval = rootmem->gfun(tplus, ark_mem->ycur, rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->ghi[i]) == ZERO)
    {
      if (rootmem->iroots[i] == 1) { return (CLOSERT); }
      zroot              = SUNTRUE;
      rootmem->iroots[i] = 1;
    }
    else
    {
      if (rootmem->iroots[i] == 1) { rootmem->glo[i] = rootmem->ghi[i]; }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (ARK_SUCCESS);
}